

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.cpp
# Opt level: O0

bool __thiscall
QOpenGLExtensions::hasOpenGLExtension(QOpenGLExtensions *this,OpenGLExtension extension)

{
  int iVar1;
  uint in_ESI;
  long *in_RDI;
  QOpenGLFunctionsPrivateEx *d;
  undefined8 local_30;
  undefined1 local_1;
  
  if (*in_RDI == 0) {
    local_30 = 0;
  }
  else {
    local_30 = *in_RDI + -0x10;
  }
  if (local_30 == 0) {
    local_1 = false;
  }
  else {
    if (*(int *)(local_30 + 0xb70) == -1) {
      iVar1 = qt_gl_resolve_extensions();
      *(int *)(local_30 + 0xb70) = iVar1;
    }
    local_1 = (*(uint *)(local_30 + 0xb70) & in_ESI) != 0;
  }
  return local_1;
}

Assistant:

bool QOpenGLExtensions::hasOpenGLExtension(QOpenGLExtensions::OpenGLExtension extension) const
{
    QOpenGLFunctionsPrivateEx *d = static_cast<QOpenGLFunctionsPrivateEx *>(d_ptr);
    if (!d)
        return false;
    if (d->m_extensions == -1)
        d->m_extensions = qt_gl_resolve_extensions();
    return (d->m_extensions & int(extension)) != 0;
}